

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanDebug.cpp
# Opt level: O0

char * VulkanUtilities::VkImageLayoutToString(VkImageLayout Layout)

{
  Char *Message;
  undefined1 local_38 [8];
  string msg;
  char *pcStack_10;
  VkImageLayout Layout_local;
  
  if (Layout == VK_IMAGE_LAYOUT_UNDEFINED) {
    pcStack_10 = "VK_IMAGE_LAYOUT_UNDEFINED";
  }
  else if (Layout == VK_IMAGE_LAYOUT_GENERAL) {
    pcStack_10 = "VK_IMAGE_LAYOUT_GENERAL";
  }
  else if (Layout == VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL) {
    pcStack_10 = "VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL";
  }
  else if (Layout == VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL) {
    pcStack_10 = "VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL";
  }
  else if (Layout == VK_IMAGE_LAYOUT_DEPTH_STENCIL_READ_ONLY_OPTIMAL) {
    pcStack_10 = "VK_IMAGE_LAYOUT_DEPTH_STENCIL_READ_ONLY_OPTIMAL";
  }
  else if (Layout == VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL) {
    pcStack_10 = "VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL";
  }
  else if (Layout == VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL) {
    pcStack_10 = "VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL";
  }
  else if (Layout == VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL) {
    pcStack_10 = "VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL";
  }
  else if (Layout == VK_IMAGE_LAYOUT_PREINITIALIZED) {
    pcStack_10 = "VK_IMAGE_LAYOUT_PREINITIALIZED";
  }
  else if (Layout == VK_IMAGE_LAYOUT_PRESENT_SRC_KHR) {
    pcStack_10 = "VK_IMAGE_LAYOUT_PRESENT_SRC_KHR";
  }
  else if (Layout == VK_IMAGE_LAYOUT_SHARED_PRESENT_KHR) {
    pcStack_10 = "VK_IMAGE_LAYOUT_SHARED_PRESENT_KHR";
  }
  else if (Layout == VK_IMAGE_LAYOUT_DEPTH_READ_ONLY_STENCIL_ATTACHMENT_OPTIMAL) {
    pcStack_10 = "VK_IMAGE_LAYOUT_DEPTH_READ_ONLY_STENCIL_ATTACHMENT_OPTIMAL";
  }
  else if (Layout == VK_IMAGE_LAYOUT_DEPTH_ATTACHMENT_STENCIL_READ_ONLY_OPTIMAL) {
    pcStack_10 = "VK_IMAGE_LAYOUT_DEPTH_ATTACHMENT_STENCIL_READ_ONLY_OPTIMAL";
  }
  else {
    msg.field_2._12_4_ = Layout;
    Diligent::FormatString<char[15]>((string *)local_38,(char (*) [15])"Unknown layout");
    Message = (Char *)std::__cxx11::string::c_str();
    Diligent::DebugAssertionFailed
              (Message,"VkImageLayoutToString",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanDebug.cpp"
               ,0x2cc);
    std::__cxx11::string::~string((string *)local_38);
    pcStack_10 = "";
  }
  return pcStack_10;
}

Assistant:

const char* VkImageLayoutToString(VkImageLayout Layout)
{
    switch (Layout)
    {
        // clang-format off
#define IMAGE_LAYOUT_TO_STRING(LAYOUT)case LAYOUT: return #LAYOUT;
        IMAGE_LAYOUT_TO_STRING(VK_IMAGE_LAYOUT_UNDEFINED)
        IMAGE_LAYOUT_TO_STRING(VK_IMAGE_LAYOUT_GENERAL)
        IMAGE_LAYOUT_TO_STRING(VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL)
        IMAGE_LAYOUT_TO_STRING(VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL)
        IMAGE_LAYOUT_TO_STRING(VK_IMAGE_LAYOUT_DEPTH_STENCIL_READ_ONLY_OPTIMAL)
        IMAGE_LAYOUT_TO_STRING(VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL)
        IMAGE_LAYOUT_TO_STRING(VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL)
        IMAGE_LAYOUT_TO_STRING(VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL)
        IMAGE_LAYOUT_TO_STRING(VK_IMAGE_LAYOUT_PREINITIALIZED)
        IMAGE_LAYOUT_TO_STRING(VK_IMAGE_LAYOUT_DEPTH_READ_ONLY_STENCIL_ATTACHMENT_OPTIMAL)
        IMAGE_LAYOUT_TO_STRING(VK_IMAGE_LAYOUT_DEPTH_ATTACHMENT_STENCIL_READ_ONLY_OPTIMAL)
        IMAGE_LAYOUT_TO_STRING(VK_IMAGE_LAYOUT_PRESENT_SRC_KHR)
        IMAGE_LAYOUT_TO_STRING(VK_IMAGE_LAYOUT_SHARED_PRESENT_KHR)
#undef IMAGE_LAYOUT_TO_STRING
        default: UNEXPECTED("Unknown layout"); return "";
            // clang-format on
    }
}